

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int root_write(int hdl,void *buffer,long nbytes)

{
  size_t sVar1;
  int local_9c;
  int local_98;
  int op;
  int astat;
  int status;
  int sock;
  int len;
  char msg [100];
  long nbytes_local;
  void *buffer_local;
  int hdl_local;
  
  astat = handleTable[hdl].sock;
  unique0x1000014d = nbytes;
  snprintf((char *)&sock,100,"%ld %ld ",handleTable[hdl].currentpos,nbytes);
  sVar1 = strlen((char *)&sock);
  status = (int)sVar1;
  op = root_send_buffer(astat,0x7d5,(char *)&sock,status + 1);
  if (op == status + 1) {
    op = NET_SendRaw(astat,buffer,(int)stack0xffffffffffffffe0,0);
    if (op == stack0xffffffffffffffe0) {
      local_98 = 0;
      root_recv_buffer(handleTable[hdl].sock,&local_9c,(char *)&local_98,4);
      if (local_98 == 0) {
        handleTable[hdl].currentpos = stack0xffffffffffffffe0 + handleTable[hdl].currentpos;
        buffer_local._4_4_ = 0;
      }
      else {
        buffer_local._4_4_ = 0x6a;
      }
    }
    else {
      buffer_local._4_4_ = 0x6a;
    }
  }
  else {
    buffer_local._4_4_ = 0x6a;
  }
  return buffer_local._4_4_;
}

Assistant:

int root_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{

  char msg[SHORTLEN];
  int len;
  int sock;
  int status;
  int astat;
  int op;

  sock = handleTable[hdl].sock;
  /* we presume here that the file position will never be > 2**31 = 2.1GB */
  snprintf(msg,SHORTLEN,"%ld %ld ",(long) handleTable[hdl].currentpos,nbytes);

  len = strlen(msg);
  status = root_send_buffer(sock,ROOTD_PUT,msg,len+1);
  if (status != len+1) {
    return (WRITE_ERROR);
  }
  status = NET_SendRaw(sock,buffer,nbytes,NET_DEFAULT);
  if (status != nbytes) {
    return (WRITE_ERROR);
  }
  astat = 0;
  status = root_recv_buffer(handleTable[hdl].sock,&op,(char *) &astat,4);

  if (astat != 0) {
    return (WRITE_ERROR);
  }
  handleTable[hdl].currentpos += nbytes;
  return(0);
}